

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

Token * __thiscall
jsonnet::internal::anon_unknown_0::Parser::parseObjectRemainder
          (Token *__return_storage_ptr__,Parser *this,AST **obj,Token *tok)

{
  LocationRange *pLVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pFVar5;
  _List_node_base *p_Var6;
  Allocator *pAVar7;
  pointer pcVar8;
  bool bVar9;
  _Base_ptr p_Var10;
  uint uVar11;
  Token *pTVar13;
  pointer pFVar14;
  AST *pAVar15;
  long lVar16;
  AST *msg;
  Object *pOVar17;
  pointer pOVar18;
  ObjectComprehension *pOVar19;
  Token *extraout_RAX;
  StaticError *pSVar20;
  string *while_;
  list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *plVar21;
  _Base_ptr p_Var22;
  _Alloc_hider _Var23;
  pointer pOVar24;
  int iVar25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  int iVar27;
  _Base_ptr p_Var28;
  _Base_ptr p_Var29;
  pointer *this_00;
  LocationRange *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar30;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar31;
  bool got_comma;
  bool plus_sugar;
  bool is_method;
  bool meth_comma;
  LocationRange *local_588;
  Kind kind;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_578;
  AST *expr1;
  Fodder colon_fodder;
  Hide field_hide;
  Token op;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> local_488;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_468;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_440;
  Fodder fodder_r;
  Fodder fodder1;
  Fodder paren_l_fodder;
  Fodder fodder2;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  specs;
  undefined8 local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  _Alloc_hider local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  _Alloc_hider local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  LocationRange local_318;
  Token tok_1;
  Fodder comma_fodder;
  Fodder fodder_l;
  ObjectFields fields;
  Identifier *id;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  AST *body;
  LocationRange idLocation;
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [3];
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_a8;
  set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  binds;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  literal_fields;
  ulong uVar12;
  
  fields.
  super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fields.
  super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  literal_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &literal_fields._M_t._M_impl.super__Rb_tree_header._M_header;
  literal_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  literal_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  literal_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  binds._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &binds._M_t._M_impl.super__Rb_tree_header._M_header;
  binds._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  binds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  binds._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  got_comma = false;
  binds._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       binds._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  literal_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       literal_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Token::Token(&tok_1,(Token *)((this->tokens->
                                super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                )._M_impl._M_node.super__List_node_base._M_next + 1));
  std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::_M_erase
            (this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
  local_578 = &op.location.file.field_2;
  local_588 = &tok_1.location;
  pLVar1 = &op.location;
  local_178 = local_d8;
  paVar26 = &local_318.file.field_2;
  bVar9 = true;
  while (while_ = (string *)(ulong)tok_1.kind, tok_1.kind != FOR) {
    if (tok_1.kind == BRACE_R) {
      pAVar7 = this->alloc;
      op._0_8_ = &op.fodder.
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      pcVar8 = (tok->location).file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&op,pcVar8,pcVar8 + (tok->location).file._M_string_length);
      op.data._M_dataplus._M_p = (pointer)(tok->location).begin.line;
      op.data._M_string_length = (tok->location).begin.column;
      op.data.field_2._M_allocated_capacity = tok_1.location.end.line;
      op.data.field_2._8_8_ = tok_1.location.end.column;
      pOVar17 = Allocator::
                make<jsonnet::internal::Object,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ObjectField,std::allocator<jsonnet::internal::ObjectField>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                          (pAVar7,(LocationRange *)&op,&tok->fodder,&fields,&got_comma,&tok_1.fodder
                          );
      *obj = &pOVar17->super_AST;
      if ((pointer *)op._0_8_ !=
          &op.fodder.
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)op._0_8_,
                        (ulong)((long)&(op.fodder.
                                        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                        ._M_impl.super__Vector_impl_data._M_finish)->kind + 1));
      }
      paVar2 = &tok_1.data.field_2;
      __return_storage_ptr__->kind = tok_1.kind;
      (__return_storage_ptr__->fodder).
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start =
           tok_1.fodder.
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->fodder).
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           tok_1.fodder.
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->fodder).
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           tok_1.fodder.
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      tok_1.fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      tok_1.fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      tok_1.fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      paVar26 = &(__return_storage_ptr__->data).field_2;
      (__return_storage_ptr__->data)._M_dataplus._M_p = (pointer)paVar26;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tok_1.data._M_dataplus._M_p == paVar2) {
        paVar26->_M_allocated_capacity =
             CONCAT71(tok_1.data.field_2._M_allocated_capacity._1_7_,
                      tok_1.data.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->data).field_2 + 8) =
             tok_1.data.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->data)._M_dataplus._M_p = tok_1.data._M_dataplus._M_p;
        (__return_storage_ptr__->data).field_2._M_allocated_capacity =
             CONCAT71(tok_1.data.field_2._M_allocated_capacity._1_7_,
                      tok_1.data.field_2._M_local_buf[0]);
      }
      paVar3 = &tok_1.stringBlockIndent.field_2;
      (__return_storage_ptr__->data)._M_string_length = tok_1.data._M_string_length;
      tok_1.data._M_string_length = 0;
      tok_1.data.field_2._M_local_buf[0] = '\0';
      paVar26 = &(__return_storage_ptr__->stringBlockIndent).field_2;
      (__return_storage_ptr__->stringBlockIndent)._M_dataplus._M_p = (pointer)paVar26;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tok_1.stringBlockIndent._M_dataplus._M_p == paVar3) {
        paVar26->_M_allocated_capacity =
             CONCAT71(tok_1.stringBlockIndent.field_2._M_allocated_capacity._1_7_,
                      tok_1.stringBlockIndent.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->stringBlockIndent).field_2 + 8) =
             tok_1.stringBlockIndent.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->stringBlockIndent)._M_dataplus._M_p =
             tok_1.stringBlockIndent._M_dataplus._M_p;
        (__return_storage_ptr__->stringBlockIndent).field_2._M_allocated_capacity =
             CONCAT71(tok_1.stringBlockIndent.field_2._M_allocated_capacity._1_7_,
                      tok_1.stringBlockIndent.field_2._M_local_buf[0]);
      }
      paVar4 = &tok_1.stringBlockTermIndent.field_2;
      (__return_storage_ptr__->stringBlockIndent)._M_string_length =
           tok_1.stringBlockIndent._M_string_length;
      tok_1.stringBlockIndent._M_string_length = 0;
      tok_1.stringBlockIndent.field_2._M_local_buf[0] = '\0';
      paVar26 = &(__return_storage_ptr__->stringBlockTermIndent).field_2;
      (__return_storage_ptr__->stringBlockTermIndent)._M_dataplus._M_p = (pointer)paVar26;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tok_1.stringBlockTermIndent._M_dataplus._M_p == paVar4) {
        paVar26->_M_allocated_capacity =
             CONCAT71(tok_1.stringBlockTermIndent.field_2._M_allocated_capacity._1_7_,
                      tok_1.stringBlockTermIndent.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->stringBlockTermIndent).field_2 + 8) =
             tok_1.stringBlockTermIndent.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->stringBlockTermIndent)._M_dataplus._M_p =
             tok_1.stringBlockTermIndent._M_dataplus._M_p;
        (__return_storage_ptr__->stringBlockTermIndent).field_2._M_allocated_capacity =
             CONCAT71(tok_1.stringBlockTermIndent.field_2._M_allocated_capacity._1_7_,
                      tok_1.stringBlockTermIndent.field_2._M_local_buf[0]);
      }
      (__return_storage_ptr__->stringBlockTermIndent)._M_string_length =
           tok_1.stringBlockTermIndent._M_string_length;
      tok_1.stringBlockTermIndent._M_string_length = 0;
      tok_1.stringBlockTermIndent.field_2._M_local_buf[0] = '\0';
      paVar26 = &(__return_storage_ptr__->location).file.field_2;
      (__return_storage_ptr__->location).file._M_dataplus._M_p = (pointer)paVar26;
      paVar30 = &tok_1.location.file.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tok_1.location.file._M_dataplus._M_p == paVar30) {
        paVar26->_M_allocated_capacity =
             CONCAT71(tok_1.location.file.field_2._M_allocated_capacity._1_7_,
                      tok_1.location.file.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->location).file.field_2 + 8) =
             tok_1.location.file.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->location).file._M_dataplus._M_p =
             tok_1.location.file._M_dataplus._M_p;
        (__return_storage_ptr__->location).file.field_2._M_allocated_capacity =
             CONCAT71(tok_1.location.file.field_2._M_allocated_capacity._1_7_,
                      tok_1.location.file.field_2._M_local_buf[0]);
      }
      (__return_storage_ptr__->location).file._M_string_length =
           tok_1.location.file._M_string_length;
      tok_1.location.file._M_string_length = 0;
      tok_1.location.file.field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->location).end.line = tok_1.location.end.line;
      (__return_storage_ptr__->location).end.column = tok_1.location.end.column;
      (__return_storage_ptr__->location).begin.line = tok_1.location.begin.line;
      (__return_storage_ptr__->location).begin.column = tok_1.location.begin.column;
      tok_1.data._M_dataplus._M_p = (pointer)paVar2;
      tok_1.stringBlockIndent._M_dataplus._M_p = (pointer)paVar3;
      tok_1.stringBlockTermIndent._M_dataplus._M_p = (pointer)paVar4;
      tok_1.location.file._M_dataplus._M_p = (pointer)paVar30;
      goto LAB_0019e897;
    }
    if (!bVar9 && (got_comma & 1U) == 0) {
      pSVar20 = (StaticError *)__cxa_allocate_exception(0x60);
      op._0_8_ = &op.fodder.
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&op,"expected a comma before next field.","");
      StaticError::StaticError(pSVar20,local_588,(string *)&op);
      __cxa_throw(pSVar20,&StaticError::typeinfo,StaticError::~StaticError);
    }
    got_comma = false;
    uVar11 = tok_1.kind - IDENTIFIER;
    uVar12 = (ulong)uVar11;
    if (uVar11 < 0x14) {
      while_ = (string *)
               ((long)&switchD_0019caa0::switchdataD_00240f9c +
               (long)(int)(&switchD_0019caa0::switchdataD_00240f9c)[uVar12]);
      switch(uVar12) {
      case 0:
      case 3:
      case 4:
      case 5:
      case 6:
      case 7:
        goto switchD_0019caa0_caseD_0;
      default:
switchD_0019caa0_caseD_1:
        pSVar20 = (StaticError *)__cxa_allocate_exception(0x60);
        op._0_8_ = &op.fodder.
                    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::string::_M_construct<char_const*>((string *)&op,"parsing field definition","")
        ;
        unexpected(pSVar20,(Parser *)&tok_1,&op,while_);
        __cxa_throw(pSVar20,&StaticError::typeinfo,StaticError::~StaticError);
      case 8:
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)&idLocation,&tok_1.fodder);
        pAVar15 = parse(this,0xf);
        colon_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        colon_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        colon_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        plVar21 = this->tokens;
        p_Var6 = (plVar21->
                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        if (*(int *)&p_Var6[1]._M_next == 0xc) {
          iVar25 = std::__cxx11::string::compare((char *)(p_Var6 + 3));
          plVar21 = this->tokens;
          if (iVar25 != 0) goto LAB_0019cc1a;
          Token::Token(&op,(Token *)((plVar21->
                                     super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                     )._M_impl._M_node.super__List_node_base._M_next + 1));
          std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
          _M_erase(this->tokens,
                   (this->tokens->
                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                   )._M_impl._M_node.super__List_node_base._M_next);
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::operator=(&colon_fodder,&op.fodder);
          msg = parse(this,0xf);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)op.location.file._M_dataplus._M_p != local_578) {
            operator_delete(op.location.file._M_dataplus._M_p,
                            op.location.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)op.stringBlockTermIndent._M_dataplus._M_p != &op.stringBlockTermIndent.field_2) {
            operator_delete(op.stringBlockTermIndent._M_dataplus._M_p,
                            op.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)op.stringBlockIndent._M_dataplus._M_p != &op.stringBlockIndent.field_2) {
            operator_delete(op.stringBlockIndent._M_dataplus._M_p,
                            op.stringBlockIndent.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)op.data._M_dataplus._M_p != &op.data.field_2) {
            operator_delete(op.data._M_dataplus._M_p,op.data.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector(&op.fodder);
          plVar21 = this->tokens;
        }
        else {
LAB_0019cc1a:
          msg = (AST *)0x0;
        }
        fodder1.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        fodder1.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        fodder1.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Token::Token(&op,(Token *)((plVar21->
                                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                   )._M_impl._M_node.super__List_node_base._M_next + 1));
        std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
        _M_erase(this->tokens,
                 (this->tokens->
                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                 )._M_impl._M_node.super__List_node_base._M_next);
        specs.
        super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)tok_1.fodder.
                      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        specs.
        super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)tok_1.fodder.
                      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        specs.
        super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)tok_1.fodder.
                      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        tok_1.kind = op.kind;
        tok_1.fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             op.fodder.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        tok_1.fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start =
             op.fodder.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
        tok_1.fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             op.fodder.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        op.fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        op.fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        op.fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)&specs);
        std::__cxx11::string::operator=((string *)&tok_1.data,(string *)&op.data);
        std::__cxx11::string::operator=
                  ((string *)&tok_1.stringBlockIndent,(string *)&op.stringBlockIndent);
        std::__cxx11::string::operator=
                  ((string *)&tok_1.stringBlockTermIndent,(string *)&op.stringBlockTermIndent);
        std::__cxx11::string::operator=((string *)local_588,(string *)pLVar1);
        tok_1.location.begin.line = op.location.begin.line;
        tok_1.location.begin.column = op.location.begin.column;
        tok_1.location.end.line = op.location.end.line;
        tok_1.location.end.column = op.location.end.column;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)op.location.file._M_dataplus._M_p != local_578) {
          operator_delete(op.location.file._M_dataplus._M_p,
                          op.location.file.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)op.stringBlockTermIndent._M_dataplus._M_p != &op.stringBlockTermIndent.field_2) {
          operator_delete(op.stringBlockTermIndent._M_dataplus._M_p,
                          op.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)op.stringBlockIndent._M_dataplus._M_p != &op.stringBlockIndent.field_2) {
          operator_delete(op.stringBlockIndent._M_dataplus._M_p,
                          op.stringBlockIndent.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)op.data._M_dataplus._M_p != &op.data.field_2) {
          operator_delete(op.data._M_dataplus._M_p,op.data.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&op.fodder);
        if (tok_1.kind == COMMA) {
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::operator=(&fodder1,&tok_1.fodder);
          Token::Token(&op,(Token *)((this->tokens->
                                     super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                     )._M_impl._M_node.super__List_node_base._M_next + 1));
          std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
          _M_erase(this->tokens,
                   (this->tokens->
                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                   )._M_impl._M_node.super__List_node_base._M_next);
          specs.
          super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)tok_1.fodder.
                        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          specs.
          super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)tok_1.fodder.
                        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
          specs.
          super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)tok_1.fodder.
                        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          tok_1.kind = op.kind;
          tok_1.fodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               op.fodder.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          tok_1.fodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_start =
               op.fodder.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
          tok_1.fodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               op.fodder.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          op.fodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          op.fodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          op.fodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)&specs);
          std::__cxx11::string::operator=((string *)&tok_1.data,(string *)&op.data);
          std::__cxx11::string::operator=
                    ((string *)&tok_1.stringBlockIndent,(string *)&op.stringBlockIndent);
          std::__cxx11::string::operator=
                    ((string *)&tok_1.stringBlockTermIndent,(string *)&op.stringBlockTermIndent);
          std::__cxx11::string::operator=((string *)local_588,(string *)pLVar1);
          tok_1.location.begin.line = op.location.begin.line;
          tok_1.location.begin.column = op.location.begin.column;
          tok_1.location.end.line = op.location.end.line;
          tok_1.location.end.column = op.location.end.column;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)op.location.file._M_dataplus._M_p != local_578) {
            operator_delete(op.location.file._M_dataplus._M_p,
                            op.location.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)op.stringBlockTermIndent._M_dataplus._M_p != &op.stringBlockTermIndent.field_2) {
            operator_delete(op.stringBlockTermIndent._M_dataplus._M_p,
                            op.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)op.stringBlockIndent._M_dataplus._M_p != &op.stringBlockIndent.field_2) {
            operator_delete(op.stringBlockIndent._M_dataplus._M_p,
                            op.stringBlockIndent.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)op.data._M_dataplus._M_p != &op.data.field_2) {
            operator_delete(op.data._M_dataplus._M_p,op.data.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector(&op.fodder);
          got_comma = true;
        }
        ObjectField::Assert((ObjectField *)&op,(Fodder *)&idLocation,pAVar15,&colon_fodder,msg,
                            &fodder1);
        std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
        ::emplace_back<jsonnet::internal::ObjectField>(&fields,(ObjectField *)&op);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&local_440);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&local_468);
        std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector(&local_488);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)op.location.file._M_dataplus._M_p != local_578) {
          operator_delete(op.location.file._M_dataplus._M_p,
                          op.location.file.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)&op.stringBlockIndent.field_2);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)((long)&op.data.field_2 + 8));
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)&op.data);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&op.fodder);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&fodder1);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&colon_fodder);
        this_01 = &idLocation;
        break;
      case 0x13:
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::vector(&fodder1,&tok_1.fodder);
        popExpect((Token *)&specs,this,IDENTIFIER,(char *)0x0);
        pAVar7 = this->alloc;
        Token::data32_abi_cxx11_((UString *)&op,(Token *)&specs);
        pFVar14 = (pointer)Allocator::makeIdentifier(pAVar7,(UString *)&op);
        if ((pointer *)op._0_8_ !=
            &op.fodder.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
          operator_delete((void *)op._0_8_,
                          (long)op.fodder.
                                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                ._M_impl.super__Vector_impl_data._M_finish * 4 + 4);
        }
        comma_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = pFVar14;
        if (binds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var10 = binds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var29 = &binds._M_t._M_impl.super__Rb_tree_header._M_header;
          do {
            p_Var28 = p_Var29;
            p_Var22 = p_Var10;
            pFVar5 = *(pointer *)(p_Var22 + 1);
            p_Var29 = p_Var22;
            if (pFVar5 < pFVar14) {
              p_Var29 = p_Var28;
            }
            p_Var10 = (&p_Var22->_M_left)[pFVar5 < pFVar14];
          } while ((&p_Var22->_M_left)[pFVar5 < pFVar14] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var29 != &binds._M_t._M_impl.super__Rb_tree_header) {
            if (pFVar5 < pFVar14) {
              p_Var22 = p_Var28;
            }
            if (*(pointer *)(p_Var22 + 1) <= pFVar14) {
              pSVar20 = (StaticError *)__cxa_allocate_exception(0x60);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &op,"duplicate local var: ",&local_378);
              StaticError::StaticError(pSVar20,&local_318,(string *)&op);
              __cxa_throw(pSVar20,&StaticError::typeinfo,StaticError::~StaticError);
            }
          }
        }
        expr1 = (AST *)((ulong)expr1 & 0xffffffffffffff00);
        fodder2.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        fodder2.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        fodder2.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        paren_l_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        paren_l_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        paren_l_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        fodder_l.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        fodder_l.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        fodder_l.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        p_Var6 = (this->tokens->
                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        iVar25 = *(int *)&p_Var6[1]._M_next;
        if (iVar25 == 7) {
          Token::Token(&op,(Token *)(p_Var6 + 1));
          std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
          _M_erase(this->tokens,
                   (this->tokens->
                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                   )._M_impl._M_node.super__List_node_base._M_next);
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::operator=(&paren_l_fodder,&op.fodder);
          idLocation.file._M_dataplus._M_p = (pointer)&idLocation.file.field_2;
          colon_fodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x12;
          idLocation.file._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&idLocation,(ulong)&colon_fodder);
          idLocation.file.field_2._M_allocated_capacity =
               (size_type)
               colon_fodder.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
          builtin_strncpy(idLocation.file._M_dataplus._M_p,"function parameter",0x12);
          idLocation.file._M_string_length =
               (size_type)
               colon_fodder.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
          idLocation.file._M_dataplus._M_p
          [(long)colon_fodder.
                 super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 ._M_impl.super__Vector_impl_data._M_start] = '\0';
          parseParams((ArgParams *)&fodder_r,this,&idLocation.file,(bool *)&expr1,&fodder_l);
          colon_fodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               fodder2.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          colon_fodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               fodder2.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          colon_fodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_start =
               fodder2.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
          fodder2.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               fodder_r.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          fodder2.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_start =
               fodder_r.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
          fodder2.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               fodder_r.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          fodder_r.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          fodder_r.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          fodder_r.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
          ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                   *)&colon_fodder);
          std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
          ~vector((ArgParams *)&fodder_r);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)idLocation.file._M_dataplus._M_p != &idLocation.file.field_2) {
            operator_delete(idLocation.file._M_dataplus._M_p,
                            idLocation.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)op.location.file._M_dataplus._M_p != local_578) {
            operator_delete(op.location.file._M_dataplus._M_p,
                            op.location.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)op.stringBlockTermIndent._M_dataplus._M_p != &op.stringBlockTermIndent.field_2) {
            operator_delete(op.stringBlockTermIndent._M_dataplus._M_p,
                            op.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)op.stringBlockIndent._M_dataplus._M_p != &op.stringBlockIndent.field_2) {
            operator_delete(op.stringBlockIndent._M_dataplus._M_p,
                            op.stringBlockIndent.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)op.data._M_dataplus._M_p != &op.data.field_2) {
            operator_delete(op.data._M_dataplus._M_p,op.data.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector(&op.fodder);
        }
        popExpect((Token *)&idLocation,this,OPERATOR,"=");
        pAVar15 = parse(this,0xf);
        std::
        _Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
        ::_M_insert_unique<jsonnet::internal::Identifier_const*const&>
                  ((_Rb_tree<jsonnet::internal::Identifier_const*,jsonnet::internal::Identifier_const*,std::_Identity<jsonnet::internal::Identifier_const*>,std::less<jsonnet::internal::Identifier_const*>,std::allocator<jsonnet::internal::Identifier_const*>>
                    *)&binds,(Identifier **)&comma_fodder);
        fodder_r.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        fodder_r.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        fodder_r.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Token::Token(&op,(Token *)((this->tokens->
                                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                   )._M_impl._M_node.super__List_node_base._M_next + 1));
        std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
        _M_erase(this->tokens,
                 (this->tokens->
                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                 )._M_impl._M_node.super__List_node_base._M_next);
        colon_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             tok_1.fodder.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        colon_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             tok_1.fodder.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        colon_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start =
             tok_1.fodder.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
        tok_1.kind = op.kind;
        tok_1.fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             op.fodder.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        tok_1.fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start =
             op.fodder.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
        tok_1.fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             op.fodder.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        op.fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        op.fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        op.fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&colon_fodder);
        std::__cxx11::string::operator=((string *)&tok_1.data,(string *)&op.data);
        std::__cxx11::string::operator=
                  ((string *)&tok_1.stringBlockIndent,(string *)&op.stringBlockIndent);
        std::__cxx11::string::operator=
                  ((string *)&tok_1.stringBlockTermIndent,(string *)&op.stringBlockTermIndent);
        std::__cxx11::string::operator=((string *)local_588,(string *)pLVar1);
        tok_1.location.begin.line = op.location.begin.line;
        tok_1.location.begin.column = op.location.begin.column;
        tok_1.location.end.line = op.location.end.line;
        tok_1.location.end.column = op.location.end.column;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)op.location.file._M_dataplus._M_p != local_578) {
          operator_delete(op.location.file._M_dataplus._M_p,
                          op.location.file.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)op.stringBlockTermIndent._M_dataplus._M_p != &op.stringBlockTermIndent.field_2) {
          operator_delete(op.stringBlockTermIndent._M_dataplus._M_p,
                          op.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)op.stringBlockIndent._M_dataplus._M_p != &op.stringBlockIndent.field_2) {
          operator_delete(op.stringBlockIndent._M_dataplus._M_p,
                          op.stringBlockIndent.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)op.data._M_dataplus._M_p != &op.data.field_2) {
          operator_delete(op.data._M_dataplus._M_p,op.data.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&op.fodder);
        if (tok_1.kind == COMMA) {
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::operator=(&fodder_r,&tok_1.fodder);
          Token::Token(&op,(Token *)((this->tokens->
                                     super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                     )._M_impl._M_node.super__List_node_base._M_next + 1));
          std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
          _M_erase(this->tokens,
                   (this->tokens->
                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                   )._M_impl._M_node.super__List_node_base._M_next);
          colon_fodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               tok_1.fodder.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          colon_fodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               tok_1.fodder.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          colon_fodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_start =
               tok_1.fodder.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
          tok_1.kind = op.kind;
          tok_1.fodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               op.fodder.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          tok_1.fodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_start =
               op.fodder.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
          tok_1.fodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               op.fodder.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          op.fodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          op.fodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          op.fodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector(&colon_fodder);
          std::__cxx11::string::operator=((string *)&tok_1.data,(string *)&op.data);
          std::__cxx11::string::operator=
                    ((string *)&tok_1.stringBlockIndent,(string *)&op.stringBlockIndent);
          std::__cxx11::string::operator=
                    ((string *)&tok_1.stringBlockTermIndent,(string *)&op.stringBlockTermIndent);
          std::__cxx11::string::operator=((string *)local_588,(string *)pLVar1);
          tok_1.location.begin.line = op.location.begin.line;
          tok_1.location.begin.column = op.location.begin.column;
          tok_1.location.end.line = op.location.end.line;
          tok_1.location.end.column = op.location.end.column;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)op.location.file._M_dataplus._M_p != local_578) {
            operator_delete(op.location.file._M_dataplus._M_p,
                            op.location.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)op.stringBlockTermIndent._M_dataplus._M_p != &op.stringBlockTermIndent.field_2) {
            operator_delete(op.stringBlockTermIndent._M_dataplus._M_p,
                            op.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)op.stringBlockIndent._M_dataplus._M_p != &op.stringBlockIndent.field_2) {
            operator_delete(op.stringBlockIndent._M_dataplus._M_p,
                            op.stringBlockIndent.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)op.data._M_dataplus._M_p != &op.data.field_2) {
            operator_delete(op.data._M_dataplus._M_p,op.data.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::~vector(&op.fodder);
          got_comma = true;
        }
        ObjectField::Local((ObjectField *)&op,&fodder1,
                           (Fodder *)
                           &specs.
                            super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&paren_l_fodder,&fodder_l,
                           iVar25 == 7,
                           (Identifier *)
                           comma_fodder.
                           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           ._M_impl.super__Vector_impl_data._M_start,(ArgParams *)&fodder2,
                           SUB81(expr1,0),(Fodder *)&idLocation.file._M_string_length,pAVar15,
                           &fodder_r);
        std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
        ::emplace_back<jsonnet::internal::ObjectField>(&fields,(ObjectField *)&op);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&local_440);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&local_468);
        std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector(&local_488);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)op.location.file._M_dataplus._M_p != local_578) {
          operator_delete(op.location.file._M_dataplus._M_p,
                          op.location.file.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)&op.stringBlockIndent.field_2);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)((long)&op.data.field_2 + 8));
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)&op.data);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&op.fodder);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&fodder_r);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_p != local_178) {
          operator_delete(local_e8._M_p,local_d8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_p != &local_f8) {
          operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_p != &local_118) {
          operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
        }
        if ((Location *)idLocation.begin.line != &idLocation.end) {
          operator_delete((void *)idLocation.begin.line,idLocation.end.line + 1);
        }
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)&idLocation.file._M_string_length);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&fodder_l);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&paren_l_fodder);
        std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *
                )&fodder2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318.file._M_dataplus._M_p != paVar26) {
          operator_delete(local_318.file._M_dataplus._M_p,
                          local_318.file.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_p != &local_328) {
          operator_delete(local_338._M_p,local_328._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_p != &local_348) {
          operator_delete(local_358._M_p,local_348._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        this_00 = &specs.
                   super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        goto LAB_0019e3bc;
      }
    }
    else {
      if (tok_1.kind != BRACKET_L) goto switchD_0019caa0_caseD_1;
switchD_0019caa0_caseD_0:
      expr1 = (AST *)0x0;
      id = (Identifier *)0x0;
      fodder1.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fodder1.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fodder1.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      fodder2.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fodder2.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fodder2.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      idLocation.file._M_dataplus._M_p = (pointer)&idLocation.file.field_2;
      idLocation.file._M_string_length = 0;
      idLocation.file.field_2._M_allocated_capacity =
           idLocation.file.field_2._M_allocated_capacity & 0xffffffffffffff00;
      idLocation.end.line = 0;
      idLocation.end.column = 0;
      idLocation.begin.line = 0;
      idLocation.begin.column = 0;
      if (uVar11 < 8) {
        pTVar13 = (Token *)(*(code *)(&DAT_00240fec + *(int *)(&DAT_00240fec + uVar12 * 4)))();
        return pTVar13;
      }
      kind = FIELD_EXPR;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(&fodder1,&tok_1.fodder);
      expr1 = parse(this,0xf);
      popExpect(&op,this,BRACKET_R,(char *)0x0);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(&fodder2,&op.fodder);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)op.location.file._M_dataplus._M_p != local_578) {
        operator_delete(op.location.file._M_dataplus._M_p,
                        op.location.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)op.stringBlockTermIndent._M_dataplus._M_p != &op.stringBlockTermIndent.field_2) {
        operator_delete(op.stringBlockTermIndent._M_dataplus._M_p,
                        op.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)op.stringBlockIndent._M_dataplus._M_p != &op.stringBlockIndent.field_2) {
        operator_delete(op.stringBlockIndent._M_dataplus._M_p,
                        op.stringBlockIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)op.data._M_dataplus._M_p != &op.data.field_2) {
        operator_delete(op.data._M_dataplus._M_p,op.data.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&op.fodder);
      is_method = false;
      meth_comma = false;
      paren_l_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      paren_l_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      paren_l_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      fodder_l.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fodder_l.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fodder_l.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      fodder_r.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fodder_r.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fodder_r.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      p_Var6 = (this->tokens->
               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      if (*(int *)&p_Var6[1]._M_next == 7) {
        Token::Token(&op,(Token *)(p_Var6 + 1));
        std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
        _M_erase(this->tokens,
                 (this->tokens->
                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                 )._M_impl._M_node.super__List_node_base._M_next);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(&fodder_l,&op.fodder);
        specs.
        super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&specs.
                       super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        colon_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x10;
        specs.
        super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)std::__cxx11::string::_M_create((ulong *)&specs,(ulong)&colon_fodder);
        specs.
        super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)colon_fodder.
                      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)
         specs.
         super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
         ._M_impl.super__Vector_impl_data._M_start = 0x7020646f6874656d;
        ((specs.
          super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
          ._M_impl.super__Vector_impl_data._M_start)->openFodder).
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x726574656d617261;
        specs.
        super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)colon_fodder.
                      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        *(char *)((long)&(colon_fodder.
                          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          ._M_impl.super__Vector_impl_data._M_start)->kind +
                 (long)&(specs.
                         super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                         ._M_impl.super__Vector_impl_data._M_start)->kind) = '\0';
        parseParams((ArgParams *)&comma_fodder,this,(string *)&specs,&meth_comma,&fodder_r);
        colon_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             paren_l_fodder.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        colon_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             paren_l_fodder.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        colon_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start =
             paren_l_fodder.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
        paren_l_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             comma_fodder.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        paren_l_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start =
             comma_fodder.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
        paren_l_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             comma_fodder.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        comma_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        comma_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        comma_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *
                )&colon_fodder);
        std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector((ArgParams *)&comma_fodder);
        if (specs.
            super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&specs.
                      super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(specs.
                          super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&(specs.
                                          super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->kind
                                 + 1));
        }
        is_method = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)op.location.file._M_dataplus._M_p != local_578) {
          operator_delete(op.location.file._M_dataplus._M_p,
                          op.location.file.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)op.stringBlockTermIndent._M_dataplus._M_p != &op.stringBlockTermIndent.field_2) {
          operator_delete(op.stringBlockTermIndent._M_dataplus._M_p,
                          op.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)op.stringBlockIndent._M_dataplus._M_p != &op.stringBlockIndent.field_2) {
          operator_delete(op.stringBlockIndent._M_dataplus._M_p,
                          op.stringBlockIndent.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)op.data._M_dataplus._M_p != &op.data.field_2) {
          operator_delete(op.data._M_dataplus._M_p,op.data.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&op.fodder);
      }
      plus_sugar = false;
      popExpect(&op,this,OPERATOR,(char *)0x0);
      _Var23 = op.data._M_dataplus;
      if (*op.data._M_dataplus._M_p == '+') {
        plus_sugar = true;
        _Var23._M_p = op.data._M_dataplus._M_p + 1;
      }
      for (lVar16 = 0; _Var23._M_p[lVar16] == ':'; lVar16 = lVar16 + 1) {
      }
      if (_Var23._M_p[lVar16] != '\0') {
        pSVar20 = (StaticError *)__cxa_allocate_exception(0x60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&specs,
                       "expected one of :, ::, :::, +:, +::, +:::, got: ",&op.data);
        StaticError::StaticError(pSVar20,local_588,(string *)&specs);
        __cxa_throw(pSVar20,&StaticError::typeinfo,StaticError::~StaticError);
      }
      iVar25 = (int)lVar16;
      if (iVar25 == 3) {
        field_hide = VISIBLE;
      }
      else if (iVar25 == 2) {
        field_hide = HIDDEN;
      }
      else {
        if (iVar25 != 1) {
          pSVar20 = (StaticError *)__cxa_allocate_exception(0x60);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&specs
                         ,"expected one of :, ::, :::, +:, +::, +:::, got: ",&op.data);
          StaticError::StaticError(pSVar20,local_588,(string *)&specs);
          __cxa_throw(pSVar20,&StaticError::typeinfo,StaticError::~StaticError);
        }
        field_hide = INHERIT;
      }
      if ((is_method == true) && (plus_sugar == true)) {
        pSVar20 = (StaticError *)__cxa_allocate_exception(0x60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&specs,
                       "cannot use +: syntax sugar in a method: ",&tok_1.data);
        StaticError::StaticError(pSVar20,local_588,(string *)&specs);
        __cxa_throw(pSVar20,&StaticError::typeinfo,StaticError::~StaticError);
      }
      if ((kind != FIELD_EXPR) &&
         (pVar31 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)&literal_fields,&tok_1.data),
         ((undefined1  [16])pVar31 & (undefined1  [16])0x1) == (undefined1  [16])0x0)) {
        pSVar20 = (StaticError *)__cxa_allocate_exception(0x60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&specs,
                       "duplicate field: ",&tok_1.data);
        StaticError::StaticError(pSVar20,local_588,(string *)&specs);
        __cxa_throw(pSVar20,&StaticError::typeinfo,StaticError::~StaticError);
      }
      body = parse(this,0xf);
      comma_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      comma_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      comma_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Token::Token((Token *)&specs,
                   (Token *)((this->tokens->
                             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                             )._M_impl._M_node.super__List_node_base._M_next + 1));
      std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
      _M_erase(this->tokens,
               (this->tokens->
               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
               )._M_impl._M_node.super__List_node_base._M_next);
      colon_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           tok_1.fodder.
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      colon_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           tok_1.fodder.
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      colon_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start =
           tok_1.fodder.
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
      tok_1.kind = (Kind)specs.
                         super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      tok_1.fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_380;
      tok_1.fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)specs.
                    super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      tok_1.fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)specs.
                    super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      specs.
      super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      specs.
      super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&colon_fodder);
      std::__cxx11::string::operator=((string *)&tok_1.data,(string *)&local_378);
      std::__cxx11::string::operator=((string *)&tok_1.stringBlockIndent,(string *)&local_358);
      std::__cxx11::string::operator=((string *)&tok_1.stringBlockTermIndent,(string *)&local_338);
      std::__cxx11::string::operator=((string *)local_588,(string *)&local_318);
      tok_1.location.begin.line = local_318.begin.line;
      tok_1.location.begin.column = local_318.begin.column;
      tok_1.location.end.line = local_318.end.line;
      tok_1.location.end.column = local_318.end.column;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318.file._M_dataplus._M_p != paVar26) {
        operator_delete(local_318.file._M_dataplus._M_p,
                        local_318.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_p != &local_328) {
        operator_delete(local_338._M_p,local_328._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_p != &local_348) {
        operator_delete(local_358._M_p,local_348._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)&specs.
                  super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      if (tok_1.kind == COMMA) {
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(&comma_fodder,&tok_1.fodder);
        Token::Token((Token *)&specs,
                     (Token *)((this->tokens->
                               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                               )._M_impl._M_node.super__List_node_base._M_next + 1));
        std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
        _M_erase(this->tokens,
                 (this->tokens->
                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                 )._M_impl._M_node.super__List_node_base._M_next);
        colon_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             tok_1.fodder.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        colon_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             tok_1.fodder.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        colon_fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start =
             tok_1.fodder.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
        tok_1.kind = (Kind)specs.
                           super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                           ._M_impl.super__Vector_impl_data._M_start;
        tok_1.fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tok_1.fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)specs.
                      super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        tok_1.fodder.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)specs.
                      super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        specs.
        super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        specs.
        super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&colon_fodder);
        std::__cxx11::string::operator=((string *)&tok_1.data,(string *)&local_378);
        std::__cxx11::string::operator=((string *)&tok_1.stringBlockIndent,(string *)&local_358);
        std::__cxx11::string::operator=((string *)&tok_1.stringBlockTermIndent,(string *)&local_338)
        ;
        std::__cxx11::string::operator=((string *)local_588,(string *)&local_318);
        tok_1.location.begin.line = local_318.begin.line;
        tok_1.location.begin.column = local_318.begin.column;
        tok_1.location.end.line = local_318.end.line;
        tok_1.location.end.column = local_318.end.column;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318.file._M_dataplus._M_p != paVar26) {
          operator_delete(local_318.file._M_dataplus._M_p,
                          local_318.file.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_p != &local_328) {
          operator_delete(local_338._M_p,local_328._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_p != &local_348) {
          operator_delete(local_358._M_p,local_348._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)&specs.
                      super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
        got_comma = true;
      }
      local_380 = (pointer)0x0;
      specs.
      super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::vector<jsonnet::internal::ObjectField,std::allocator<jsonnet::internal::ObjectField>>::
      emplace_back<jsonnet::internal::ObjectField::Kind&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::ObjectField::Hide&,bool&,bool&,jsonnet::internal::AST*&,jsonnet::internal::Identifier_const*&,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                ((vector<jsonnet::internal::ObjectField,std::allocator<jsonnet::internal::ObjectField>>
                  *)&fields,&kind,&fodder1,&fodder2,&fodder_l,&fodder_r,&field_hide,&plus_sugar,
                 &is_method,&expr1,&id,&idLocation,
                 (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                  *)&paren_l_fodder,&meth_comma,&op.fodder,&body,(void **)&specs,&comma_fodder);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&comma_fodder);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)op.location.file._M_dataplus._M_p != local_578) {
        operator_delete(op.location.file._M_dataplus._M_p,
                        op.location.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)op.stringBlockTermIndent._M_dataplus._M_p != &op.stringBlockTermIndent.field_2) {
        operator_delete(op.stringBlockTermIndent._M_dataplus._M_p,
                        op.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)op.stringBlockIndent._M_dataplus._M_p != &op.stringBlockIndent.field_2) {
        operator_delete(op.stringBlockIndent._M_dataplus._M_p,
                        op.stringBlockIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)op.data._M_dataplus._M_p != &op.data.field_2) {
        operator_delete(op.data._M_dataplus._M_p,op.data.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&op.fodder);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&fodder_r);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&fodder_l);
      std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
              &paren_l_fodder);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)idLocation.file._M_dataplus._M_p != &idLocation.file.field_2) {
        operator_delete(idLocation.file._M_dataplus._M_p,
                        idLocation.file.field_2._M_allocated_capacity + 1);
      }
      this_00 = (pointer *)&fodder2;
LAB_0019e3bc:
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)this_00);
      this_01 = (LocationRange *)&fodder1;
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)this_01);
    bVar9 = false;
  }
  if (fields.
      super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      fields.
      super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar25 = 0;
    iVar27 = 0;
    pOVar18 = (pointer)0x0;
    pOVar24 = fields.
              super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pOVar24->kind != LOCAL) {
        if (pOVar24->kind == ASSERT) {
          iVar27 = iVar27 + 1;
        }
        else {
          iVar25 = iVar25 + 1;
          pOVar18 = pOVar24;
        }
      }
      pOVar24 = pOVar24 + 1;
    } while (pOVar24 !=
             fields.
             super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if (iVar27 != 0) {
      pSVar20 = (StaticError *)__cxa_allocate_exception(0x60);
      op._0_8_ = &op.fodder.
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&op,"object comprehension cannot have asserts.","");
      StaticError::StaticError(pSVar20,local_588,(string *)&op);
      __cxa_throw(pSVar20,&StaticError::typeinfo,StaticError::~StaticError);
    }
    if (iVar25 == 1) {
      if (pOVar18->hide != INHERIT) {
        pSVar20 = (StaticError *)__cxa_allocate_exception(0x60);
        op._0_8_ = &op.fodder.
                    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&op,"object comprehensions cannot have hidden fields.","");
        StaticError::StaticError(pSVar20,local_588,(string *)&op);
        __cxa_throw(pSVar20,&StaticError::typeinfo,StaticError::~StaticError);
      }
      if (pOVar18->kind != FIELD_EXPR) {
        pSVar20 = (StaticError *)__cxa_allocate_exception(0x60);
        op._0_8_ = &op.fodder.
                    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&op,"object comprehensions can only have [e] fields.","");
        StaticError::StaticError(pSVar20,local_588,(string *)&op);
        __cxa_throw(pSVar20,&StaticError::typeinfo,StaticError::~StaticError);
      }
      specs.
      super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      specs.
      super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      specs.
      super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector(&local_a8,&tok_1.fodder);
      parseComprehensionSpecs(__return_storage_ptr__,this,BRACE_R,&local_a8,&specs);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&local_a8);
      pAVar7 = this->alloc;
      op._0_8_ = &op.fodder.
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      pcVar8 = (tok->location).file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&op,pcVar8,pcVar8 + (tok->location).file._M_string_length);
      op.data._M_dataplus._M_p = (pointer)(tok->location).begin.line;
      op.data._M_string_length = (tok->location).begin.column;
      op.data.field_2._M_allocated_capacity = (__return_storage_ptr__->location).end.line;
      op.data.field_2._8_8_ = (__return_storage_ptr__->location).end.column;
      pOVar19 = Allocator::
                make<jsonnet::internal::ObjectComprehension,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ObjectField,std::allocator<jsonnet::internal::ObjectField>>&,bool&,std::vector<jsonnet::internal::ComprehensionSpec,std::allocator<jsonnet::internal::ComprehensionSpec>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                          (pAVar7,(LocationRange *)&op,&tok->fodder,&fields,&got_comma,&specs,
                           &__return_storage_ptr__->fodder);
      *obj = &pOVar19->super_AST;
      if ((pointer *)op._0_8_ !=
          &op.fodder.
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)op._0_8_,
                        (ulong)((long)&(op.fodder.
                                        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                        ._M_impl.super__Vector_impl_data._M_finish)->kind + 1));
      }
      std::
      vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
      ::~vector(&specs);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tok_1.location.file._M_dataplus._M_p != &tok_1.location.file.field_2) {
        operator_delete(tok_1.location.file._M_dataplus._M_p,
                        CONCAT71(tok_1.location.file.field_2._M_allocated_capacity._1_7_,
                                 tok_1.location.file.field_2._M_local_buf[0]) + 1);
      }
LAB_0019e897:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tok_1.stringBlockTermIndent._M_dataplus._M_p != &tok_1.stringBlockTermIndent.field_2) {
        operator_delete(tok_1.stringBlockTermIndent._M_dataplus._M_p,
                        CONCAT71(tok_1.stringBlockTermIndent.field_2._M_allocated_capacity._1_7_,
                                 tok_1.stringBlockTermIndent.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tok_1.stringBlockIndent._M_dataplus._M_p != &tok_1.stringBlockIndent.field_2) {
        operator_delete(tok_1.stringBlockIndent._M_dataplus._M_p,
                        CONCAT71(tok_1.stringBlockIndent.field_2._M_allocated_capacity._1_7_,
                                 tok_1.stringBlockIndent.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tok_1.data._M_dataplus._M_p != &tok_1.data.field_2) {
        operator_delete(tok_1.data._M_dataplus._M_p,
                        CONCAT71(tok_1.data.field_2._M_allocated_capacity._1_7_,
                                 tok_1.data.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&tok_1.fodder);
      std::
      _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::~_Rb_tree(&binds._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&literal_fields._M_t);
      std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
      ~vector(&fields);
      return extraout_RAX;
    }
  }
  pSVar20 = (StaticError *)__cxa_allocate_exception(0x60);
  op._0_8_ = &op.fodder.
              super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&op,"object comprehension can only have one field.","");
  StaticError::StaticError(pSVar20,local_588,(string *)&op);
  __cxa_throw(pSVar20,&StaticError::typeinfo,StaticError::~StaticError);
}

Assistant:

Token parseObjectRemainder(AST *&obj, const Token &tok)
    {
        ObjectFields fields;
        std::set<std::string> literal_fields;  // For duplicate fields detection.
        std::set<const Identifier *> binds;    // For duplicate locals detection.

        bool got_comma = false;
        bool first = true;
        Token next = pop();

        do {
            if (next.kind == Token::BRACE_R) {
                obj = alloc->make<Object>(
                    span(tok, next), tok.fodder, fields, got_comma, next.fodder);
                return next;

            } else if (next.kind == Token::FOR) {
                // It's a comprehension
                unsigned num_fields = 0;
                unsigned num_asserts = 0;
                const ObjectField *field_ptr = nullptr;
                for (const auto &field : fields) {
                    if (field.kind == ObjectField::LOCAL)
                        continue;
                    if (field.kind == ObjectField::ASSERT) {
                        num_asserts++;
                        continue;
                    }
                    field_ptr = &field;
                    num_fields++;
                }
                if (num_asserts > 0) {
                    auto msg = "object comprehension cannot have asserts.";
                    throw StaticError(next.location, msg);
                }
                if (num_fields != 1) {
                    auto msg = "object comprehension can only have one field.";
                    throw StaticError(next.location, msg);
                }
                const ObjectField &field = *field_ptr;

                if (field.hide != ObjectField::INHERIT) {
                    auto msg = "object comprehensions cannot have hidden fields.";
                    throw StaticError(next.location, msg);
                }

                if (field.kind != ObjectField::FIELD_EXPR) {
                    auto msg = "object comprehensions can only have [e] fields.";
                    throw StaticError(next.location, msg);
                }

                std::vector<ComprehensionSpec> specs;
                Token last = parseComprehensionSpecs(Token::BRACE_R, next.fodder, specs);
                obj = alloc->make<ObjectComprehension>(
                    span(tok, last), tok.fodder, fields, got_comma, specs, last.fodder);

                return last;
            }

            if (!got_comma && !first)
                throw StaticError(next.location, "expected a comma before next field.");

            first = false;
            got_comma = false;

            switch (next.kind) {
                case Token::BRACKET_L:
                case Token::IDENTIFIER:
                case Token::STRING_DOUBLE:
                case Token::STRING_SINGLE:
                case Token::STRING_BLOCK:
                case Token::VERBATIM_STRING_DOUBLE:
                case Token::VERBATIM_STRING_SINGLE: {
                    ObjectField::Kind kind;
                    AST *expr1 = nullptr;
                    const Identifier *id = nullptr;
                    Fodder fodder1, fodder2;
                    LocationRange idLocation;
                    if (next.kind == Token::IDENTIFIER) {
                        fodder1 = next.fodder;
                        kind = ObjectField::FIELD_ID;
                        id = alloc->makeIdentifier(next.data32());
                        idLocation = next.location;
                    } else if (next.kind == Token::STRING_DOUBLE) {
                        kind = ObjectField::FIELD_STR;
                        expr1 = alloc->make<LiteralString>(next.location,
                                                           next.fodder,
                                                           next.data32(),
                                                           LiteralString::DOUBLE,
                                                           "",
                                                           "");
                    } else if (next.kind == Token::STRING_SINGLE) {
                        kind = ObjectField::FIELD_STR;
                        expr1 = alloc->make<LiteralString>(next.location,
                                                           next.fodder,
                                                           next.data32(),
                                                           LiteralString::SINGLE,
                                                           "",
                                                           "");
                    } else if (next.kind == Token::STRING_BLOCK) {
                        kind = ObjectField::FIELD_STR;
                        expr1 = alloc->make<LiteralString>(next.location,
                                                           next.fodder,
                                                           next.data32(),
                                                           LiteralString::BLOCK,
                                                           next.stringBlockIndent,
                                                           next.stringBlockTermIndent);
                    } else if (next.kind == Token::VERBATIM_STRING_SINGLE) {
                        kind = ObjectField::FIELD_STR;
                        expr1 = alloc->make<LiteralString>(next.location,
                                                           next.fodder,
                                                           next.data32(),
                                                           LiteralString::VERBATIM_SINGLE,
                                                           "",
                                                           "");
                    } else if (next.kind == Token::VERBATIM_STRING_DOUBLE) {
                        kind = ObjectField::FIELD_STR;
                        expr1 = alloc->make<LiteralString>(next.location,
                                                           next.fodder,
                                                           next.data32(),
                                                           LiteralString::VERBATIM_DOUBLE,
                                                           "",
                                                           "");
                    } else {
                        kind = ObjectField::FIELD_EXPR;
                        fodder1 = next.fodder;
                        expr1 = parse(MAX_PRECEDENCE);
                        Token bracket_r = popExpect(Token::BRACKET_R);
                        fodder2 = bracket_r.fodder;
                    }

                    bool is_method = false;
                    bool meth_comma = false;
                    ArgParams params;
                    Fodder fodder_l;
                    Fodder fodder_r;
                    if (peek().kind == Token::PAREN_L) {
                        Token paren_l = pop();
                        fodder_l = paren_l.fodder;
                        params = parseParams("method parameter", meth_comma, fodder_r);
                        is_method = true;
                    }

                    bool plus_sugar = false;

                    Token op = popExpect(Token::OPERATOR);
                    const char *od = op.data.c_str();
                    if (*od == '+') {
                        plus_sugar = true;
                        od++;
                    }
                    unsigned colons = 0;
                    for (; *od != '\0'; ++od) {
                        if (*od != ':') {
                            throw StaticError(
                                next.location,
                                "expected one of :, ::, :::, +:, +::, +:::, got: " + op.data);
                        }
                        ++colons;
                    }
                    ObjectField::Hide field_hide;
                    switch (colons) {
                        case 1: field_hide = ObjectField::INHERIT; break;

                        case 2: field_hide = ObjectField::HIDDEN; break;

                        case 3: field_hide = ObjectField::VISIBLE; break;

                        default:
                            throw StaticError(
                                next.location,
                                "expected one of :, ::, :::, +:, +::, +:::, got: " + op.data);
                    }

                    // Basic checks for invalid Jsonnet code.
                    if (is_method && plus_sugar) {
                        throw StaticError(next.location,
                                          "cannot use +: syntax sugar in a method: " + next.data);
                    }
                    if (kind != ObjectField::FIELD_EXPR) {
                        if (!literal_fields.insert(next.data).second) {
                            throw StaticError(next.location, "duplicate field: " + next.data);
                        }
                    }

                    AST *body = parse(MAX_PRECEDENCE);

                    Fodder comma_fodder;
                    next = pop();
                    if (next.kind == Token::COMMA) {
                        comma_fodder = next.fodder;
                        next = pop();
                        got_comma = true;
                    }
                    fields.emplace_back(kind,
                                        fodder1,
                                        fodder2,
                                        fodder_l,
                                        fodder_r,
                                        field_hide,
                                        plus_sugar,
                                        is_method,
                                        expr1,
                                        id,
                                        idLocation,
                                        params,
                                        meth_comma,
                                        op.fodder,
                                        body,
                                        nullptr,
                                        comma_fodder);
                } break;

                case Token::LOCAL: {
                    Fodder local_fodder = next.fodder;
                    Token var_id = popExpect(Token::IDENTIFIER);
                    auto *id = alloc->makeIdentifier(var_id.data32());

                    if (binds.find(id) != binds.end()) {
                        throw StaticError(var_id.location, "duplicate local var: " + var_id.data);
                    }
                    bool is_method = false;
                    bool func_comma = false;
                    ArgParams params;
                    Fodder paren_l_fodder;
                    Fodder paren_r_fodder;
                    if (peek().kind == Token::PAREN_L) {
                        Token paren_l = pop();
                        paren_l_fodder = paren_l.fodder;
                        is_method = true;
                        params = parseParams("function parameter", func_comma, paren_r_fodder);
                    }
                    Token eq = popExpect(Token::OPERATOR, "=");
                    AST *body = parse(MAX_PRECEDENCE);
                    binds.insert(id);

                    Fodder comma_fodder;
                    next = pop();
                    if (next.kind == Token::COMMA) {
                        comma_fodder = next.fodder;
                        next = pop();
                        got_comma = true;
                    }
                    fields.push_back(ObjectField::Local(local_fodder,
                                                        var_id.fodder,
                                                        paren_l_fodder,
                                                        paren_r_fodder,
                                                        is_method,
                                                        id,
                                                        params,
                                                        func_comma,
                                                        eq.fodder,
                                                        body,
                                                        comma_fodder));

                } break;

                case Token::ASSERT: {
                    Fodder assert_fodder = next.fodder;
                    AST *cond = parse(MAX_PRECEDENCE);
                    AST *msg = nullptr;
                    Fodder colon_fodder;
                    if (peek().kind == Token::OPERATOR && peek().data == ":") {
                        Token colon = pop();
                        colon_fodder = colon.fodder;
                        msg = parse(MAX_PRECEDENCE);
                    }

                    Fodder comma_fodder;
                    next = pop();
                    if (next.kind == Token::COMMA) {
                        comma_fodder = next.fodder;
                        next = pop();
                        got_comma = true;
                    }
                    fields.push_back(
                        ObjectField::Assert(assert_fodder, cond, colon_fodder, msg, comma_fodder));
                } break;

                default: throw unexpected(next, "parsing field definition");
            }

        } while (true);
    }